

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_cbegin_cend_Test::TestBody(string_view_cbegin_cend_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_90;
  Message local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60;
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  const_iterator end;
  const_iterator iter;
  undefined1 local_20 [7];
  char count;
  string_view sv;
  string_view_cbegin_cend_Test *this_local;
  
  sv.size_ = (size_type)this;
  wabt::string_view::string_view((string_view *)local_20,"012345");
  iter._7_1_ = '\0';
  end = wabt::string_view::cbegin((string_view *)local_20);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       wabt::string_view::cend((string_view *)local_20);
  while( true ) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)end ==
        gtest_ar.message_.ptr_) {
      local_7c = 6;
      testing::internal::EqHelper<false>::Compare<int,char>
                ((EqHelper<false> *)local_78,"6","count",&local_7c,(char *)((long)&iter + 7));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
      if (!bVar1) {
        testing::Message::Message(&local_88);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                   ,0x61,pcVar2);
        testing::internal::AssertHelper::operator=(&local_90,&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        testing::Message::~Message(&local_88);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
      return;
    }
    local_4c = iter._7_1_ + 0x30;
    testing::internal::EqHelper<false>::Compare<int,char>
              ((EqHelper<false> *)local_48,"\'0\' + count","*iter",&local_4c,end);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
    if (!bVar1) {
      testing::Message::Message(&local_58);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
                 ,0x5e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::Message::~Message(&local_58);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    if (gtest_ar_1.message_.ptr_._4_4_ != 0) break;
    iter._7_1_ = iter._7_1_ + '\x01';
    end = end + 1;
  }
  return;
}

Assistant:

TEST(string_view, cbegin_cend) {
  const string_view sv("012345");

  char count = 0;
  for (auto iter = sv.cbegin(), end = sv.cend(); iter != end; ++iter) {
    ASSERT_EQ('0' + count, *iter);
    ++count;
  }
  ASSERT_EQ(6, count);
}